

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall SignalSwitcher::~SignalSwitcher(SignalSwitcher *this)

{
  SignalSwitcher *in_RDI;
  
  if (((in_RDI->is_active & 1U) != 0) && (handle_is_locked)) {
    interrupt_switch = false;
  }
  restore_handle(in_RDI);
  return;
}

Assistant:

SignalSwitcher::~SignalSwitcher()
{
    #ifndef _FOR_PYTHON
    #pragma omp critical
    {
        if (this->is_active && handle_is_locked)
            interrupt_switch = false;
    }
    #endif
    this->restore_handle();
}